

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O3

void __thiscall cmInstalledFile::SetName(cmInstalledFile *this,cmMakefile *mf,string *name)

{
  undefined8 uVar1;
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  undefined1 local_60 [40];
  cmListFileBacktrace local_38;
  
  cmMakefile::GetBacktrace(&local_38,mf);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)(local_60 + 8),&local_38);
  std::__cxx11::string::_M_assign((string *)this);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_60,(string *)(local_60 + 8));
  uVar1 = local_60._0_8_;
  local_60._0_8_ = (cmState *)0x0;
  this->NameExpression = (cmCompiledGeneratorExpression *)uVar1;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_60);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_60 + 8));
  cmListFileBacktrace::~cmListFileBacktrace(&local_38);
  return;
}

Assistant:

void cmInstalledFile::SetName(cmMakefile* mf, const std::string& name)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(backtrace);

  this->Name = name;
  this->NameExpression = ge.Parse(name).release();
}